

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int header_get_priority(HEADER_HANDLE header,uint8_t *priority_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  HEADER_INSTANCE *header_instance;
  uint32_t item_count;
  int result;
  uint8_t *priority_value_local;
  HEADER_HANDLE header_local;
  
  if (header == (HEADER_HANDLE)0x0) {
    header_instance._4_4_ = 0x3a20;
  }
  else {
    _item_count = priority_value;
    priority_value_local = (uint8_t *)header;
    iVar1 = amqpvalue_get_composite_item_count(header->composite_value,(uint32_t *)&header_instance)
    ;
    if (iVar1 == 0) {
      if ((uint)header_instance < 2) {
        *_item_count = '\x04';
        header_instance._4_4_ = 0;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(header->composite_value,1);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          *_item_count = '\x04';
          header_instance._4_4_ = 0;
        }
        else {
          iVar1 = amqpvalue_get_ubyte(value,_item_count);
          if (iVar1 == 0) {
            header_instance._4_4_ = 0;
          }
          else {
            AVar2 = amqpvalue_get_type(value);
            if (AVar2 == AMQP_TYPE_NULL) {
              *_item_count = '\x04';
              header_instance._4_4_ = 0;
            }
            else {
              header_instance._4_4_ = 0x3a41;
            }
          }
        }
      }
    }
    else {
      header_instance._4_4_ = 0x3a28;
    }
  }
  return header_instance._4_4_;
}

Assistant:

int header_get_priority(HEADER_HANDLE header, uint8_t* priority_value)
{
    int result;

    if (header == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)header;
        if (amqpvalue_get_composite_item_count(header_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 1)
            {
                *priority_value = 4;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(header_instance->composite_value, 1);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *priority_value = 4;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_ubyte(item_value, priority_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *priority_value = 4;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}